

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O1

void __thiscall PointDiffRetractation::test_method(PointDiffRetractation *this)

{
  double *__ptr;
  Index IVar1;
  Index IVar2;
  bool bVar3;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  MatrixXd J;
  MatrixXd Jtest;
  Vector3d v;
  SO3<mnf::ExpMapMatrix> S;
  Point x;
  Matrix<double,__1,__1,_0,__1,__1> local_368;
  Matrix<double,__1,__1,_0,__1,__1> local_348;
  Scalar local_330;
  undefined **local_328;
  ulong uStack_320;
  undefined8 *local_318;
  char **local_310;
  undefined8 uStack_308;
  char *local_2f8;
  char *local_2f0;
  Scalar local_2e8 [2];
  shared_count sStack_2d8;
  undefined *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined *local_2b8;
  undefined *local_2b0;
  undefined *local_2a8;
  undefined *local_2a0;
  undefined *local_298;
  undefined *local_290;
  undefined *local_288;
  undefined *local_280;
  undefined *local_278;
  undefined *local_270;
  undefined *local_268;
  undefined *local_260;
  undefined *local_258;
  undefined *local_250;
  undefined *local_248;
  undefined *local_240;
  undefined *local_238;
  undefined *local_230;
  undefined *local_228;
  undefined *local_220;
  undefined *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  SO3<mnf::ExpMapMatrix> local_1e0;
  undefined1 local_140 [24];
  long local_128;
  
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_1e0);
  local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  free((void *)0x0);
  local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       Eigen::internal::conditional_aligned_new_auto<double,true>(0x1b);
  local_140._0_8_ = &local_348;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 9;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 3;
  local_140._8_8_ = (void *)0x0;
  local_140._16_8_ = 1;
  local_128 = 1;
  *local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = 0.0
  ;
  local_328 = (undefined **)0x3f6d54e8433e0918;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140,
                      (Scalar *)&local_328);
  local_2d0 = (undefined *)0xbfe1dd4409c395db;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_2d0);
  local_2e8[0] = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,local_2e8);
  local_2f8 = (char *)0x3fe4ac985e75dd74;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_2f8);
  local_330 = 0.634553549147103;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_330);
  local_218 = (undefined *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_218);
  local_220 = (undefined *)0xbfe86cb6efa16cf0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_220);
  local_228 = (undefined *)0x3fe11a9a84559131;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_228);
  local_230 = (undefined *)0xbf6d54e8433e0918;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_230);
  local_238 = (undefined *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_238);
  local_240 = (undefined *)0xbfea8c8fa9344090;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_240);
  local_248 = (undefined *)0xbfe4ac985e75dd74;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_248);
  local_250 = (undefined *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_250);
  local_258 = (undefined *)0xbfdb25ecde55e872;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_258);
  local_260 = (undefined *)0x3fe86cb6efa16cf0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_260);
  local_268 = (undefined *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_268);
  local_270 = (undefined *)0xbfd73a8362a21086;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_270);
  local_278 = (undefined *)0x3fe1dd4409c395db;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_278);
  local_280 = (undefined *)0x3fea8c8fa9344090;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_280);
  local_288 = (undefined *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_288);
  local_290 = (undefined *)0xbfe44e433ea4b89e;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_290);
  local_298 = (undefined *)0x3fdb25ecde55e872;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_298);
  local_2a0 = (undefined *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_2a0);
  local_2a8 = (undefined *)0xbfe11a9a84559131;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_2a8);
  local_2b0 = (undefined *)0x3fd73a8362a21086;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_2b0);
  local_2b8 = (undefined *)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar4,(Scalar *)&local_2b8);
  if (((local_128 + local_140._8_8_ ==
        (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140._0_8_)->m_storage)
        .m_rows) ||
      ((((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140._0_8_)->m_storage).
       m_cols == 0)) &&
     (local_140._16_8_ ==
      (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140._0_8_)->m_storage).
      m_cols)) {
    local_2d0 = (undefined *)0x3fe5c5a1cac08312;
    local_2c8 = 0xbfcb09b738e6d15b;
    local_2c0 = 0x3fe21e4b44a1f080;
    mnf::Manifold::getZero();
    local_310 = (char **)0x0;
    uStack_308 = 0;
    uStack_320 = 3;
    local_328 = &local_2d0;
    mnf::Point::retractation((Point *)local_140,(Ref *)local_140);
    free(local_310);
    mnf::Point::diffRetractation();
    IVar2 = local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols;
    IVar1 = local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    __ptr = local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data;
    local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)local_328;
    local_328 = (undefined **)__ptr;
    local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         uStack_320;
    local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)local_318;
    uStack_320 = IVar1;
    local_318 = (undefined8 *)IVar2;
    free(__ptr);
    local_1f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
    ;
    local_1e8 = "";
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0xd8);
    local_330 = 1e-12;
    bVar3 = Eigen::internal::
            isApprox_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
            ::run(&local_368,&local_348,&local_330);
    local_2e8[0] = (Scalar)CONCAT71(local_2e8[0]._1_7_,bVar3);
    local_2e8[1] = 0.0;
    sStack_2d8.pi_ = (sp_counted_base *)0x0;
    local_2f8 = "J.isApprox(Jtest)";
    local_2f0 = "";
    uStack_320 = uStack_320 & 0xffffffffffffff00;
    local_328 = &PTR__lazy_ostream_00129c08;
    local_318 = &boost::unit_test::lazy_ostream::inst;
    local_210 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
    ;
    local_208 = "";
    local_310 = &local_2f8;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_2d8);
    mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_128);
    free((void *)local_140._8_8_);
    free(local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    free(local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    local_1e0._0_8_ = &PTR__SO3_001299c0;
    mnf::ReusableTemporaryMap::~ReusableTemporaryMap
              ((ReusableTemporaryMap *)((long)&local_1e0 + 0x58));
    mnf::Manifold::~Manifold(&local_1e0.super_Manifold);
    return;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(PointDiffRetractation)
{
  SO3<ExpMapMatrix> S;
  Eigen::MatrixXd J;
  Eigen::MatrixXd Jtest(9, 3);
  Jtest << 0, 0.003580526006716, -0.558259982176135, 0, 0.646068748944272,
      0.634553549147103, 0, -0.763270824459509, 0.534497507539106,
      -0.003580526006716, 0, -0.829658346630838, -0.646068748944272, 0,
      -0.424189774632061, 0.763270824459509, 0, -0.362946363755562,
      0.558259982176135, 0.829658346630838, 0, -0.634553549147103,
      0.424189774632061, 0, -0.534497507539106, 0.362946363755562, 0;
  Eigen::Vector3d v(0.680375, -0.211234, 0.566198);
  Point x = S.getZero();
  x.retractation(x, v);
  J = x.diffRetractation();
  BOOST_CHECK(J.isApprox(Jtest));
}